

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O2

void sfts_write_image(sfts_t *f,void *pix,size_t w,size_t h,int t)

{
  int *status;
  void *__dest;
  sbyte sVar1;
  int line;
  long lVar2;
  char *fmt;
  char *errtext;
  size_t __n;
  void *__src;
  undefined8 uVar3;
  int local_84;
  long pels [2];
  char _msg [31];
  
  pels[0]._0_4_ = 1;
  pels[0]._4_4_ = 0;
  pels[1] = 1;
  uVar3 = 1;
  sVar1 = 1;
  if (t == 2) {
    local_84 = 0x14;
  }
  else {
    errtext = (char *)(ulong)(uint)t;
    if (t == 0x200) {
      local_84 = 0x52;
      sVar1 = 3;
    }
    else if (t == 0x20) {
      local_84 = 0x15;
    }
    else {
      if (t == 0x40) {
        local_84 = 0x1f;
      }
      else if (t == 0x100) {
        local_84 = 0x2a;
      }
      else {
        if (t != 4) {
          fmt = "FITS: data type not implemented: %d";
          line = 0x18b;
          goto LAB_00114894;
        }
        local_84 = 0x1e;
      }
      sVar1 = 2;
    }
  }
  status = &f->stat;
  __n = (size_t)((int)w << sVar1);
  __dest = (void *)g_malloc(__n);
  __src = (void *)((long)pix + (h - 1) * __n);
  for (lVar2 = 1; lVar2 - h != 1; lVar2 = lVar2 + 1) {
    pels[1] = lVar2;
    memcpy(__dest,__src,__n);
    ffppx(f->fts,local_84,pels,w,__dest,status);
    __src = (void *)((long)__src - __n);
  }
  g_free(__dest);
  ffpcks(f->fts,status);
  if (f->stat == 0) {
    return;
  }
  if (f->name == (char *)0x0) {
    uVar3 = g_strdup("memory");
  }
  else {
    uVar3 = g_path_get_basename();
  }
  errtext = _msg;
  ffgerr(*status,errtext);
  _msg[0x1e] = '\0';
  fmt = "FITS: %s: %s";
  line = 0x198;
LAB_00114894:
  _p2sc_msg("sfts_write_image",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
            ,line,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,fmt,errtext,uVar3);
  exit(1);
}

Assistant:

void sfts_write_image(sfts_t *f, const void *pix, size_t w, size_t h, int t) {
    int *s = &f->stat, ft, ls;
    long pels[] = { 1, 1 };

    switch (t) {
    case SUINT16:
        ft = TUSHORT;
        ls = w * sizeof(guint16);
        break;
    case SUINT32:
        ft = TUINT;
        ls = w * sizeof(guint32);
        break;
    case SINT16:
        ft = TSHORT;
        ls = w * sizeof(gint16);
        break;
    case SINT32:
        ft = TINT;
        ls = w * sizeof(gint32);
        break;
    case SFLOAT:
        ft = TFLOAT;
        ls = w * sizeof(float);
        break;
    case SDOUBLE:
        ft = TDOUBLE;
        ls = w * sizeof(double);
        break;
    default:
        P2SC_Msg(LVL_FATAL_FITS, "FITS: data type not implemented: %d", t);
        return;
    }

    void *line = g_malloc(ls);
    for (size_t j = 0; j < h; ++j) {
        pels[1] = j + 1;
        memcpy(line, (const guint8 *) pix + (h - 1 - j) * ls, ls);
        fits_write_pix(f->fts, ft, pels, w, line, s);
    }
    g_free(line);

    fits_write_chksum(f->fts, s);
    CHK_FTS(f);
}